

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_font_atlas_cleanup(nk_font_atlas *atlas)

{
  nk_font_config *iter;
  nk_font_config *pnVar1;
  nk_font_config *pnVar2;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x30ee,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x30ef,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x30f0,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free != (nk_plugin_free)0x0) {
      for (pnVar1 = atlas->config; pnVar1 != (nk_font_config *)0x0; pnVar1 = pnVar1->next) {
        for (pnVar2 = pnVar1->n; pnVar2 != pnVar1; pnVar2 = pnVar2->n) {
          (*(atlas->permanent).free)((atlas->permanent).userdata,pnVar2->ttf_blob);
          pnVar2->ttf_blob = (void *)0x0;
        }
        (*(atlas->permanent).free)((atlas->permanent).userdata,pnVar1->ttf_blob);
        pnVar1->ttf_blob = (void *)0x0;
      }
      return;
    }
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x30f2,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x30f1,"void nk_font_atlas_cleanup(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_cleanup(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;
    if (atlas->config) {
        struct nk_font_config *iter;
        for (iter = atlas->config; iter; iter = iter->next) {
            struct nk_font_config *i;
            for (i = iter->n; i != iter; i = i->n) {
                atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
                i->ttf_blob = 0;
            }
            atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            iter->ttf_blob = 0;
        }
    }
}